

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O2

content_type __thiscall cinatra::coro_http_request::get_content_type(coro_http_request *this)

{
  bool bVar1;
  content_type cVar2;
  size_type sVar3;
  string_view key;
  string_view content_type;
  
  bVar1 = is_chunked(this);
  if (bVar1) {
    cVar2 = chunked;
  }
  else {
    key._M_str = "content-type";
    key._M_len = 0xc;
    content_type = get_header_value(this,key);
    if (content_type._M_len == 0) {
      cVar2 = unknown - this->is_websocket_;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&content_type,"application/x-www-form-urlencoded",0);
      if (sVar3 == 0xffffffffffffffff) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&content_type,"multipart/form-data",0);
        if (sVar3 == 0xffffffffffffffff) {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&content_type,"application/octet-stream",0);
          cVar2 = (uint)(sVar3 != 0xffffffffffffffff) << 2;
        }
        else {
          cVar2 = multipart;
        }
      }
      else {
        cVar2 = urlencoded;
      }
    }
  }
  return cVar2;
}

Assistant:

content_type get_content_type() {
    if (is_chunked())
      return content_type::chunked;

    auto content_type = get_header_value("content-type");
    if (!content_type.empty()) {
      if (content_type.find("application/x-www-form-urlencoded") !=
          std::string_view::npos) {
        return content_type::urlencoded;
      }
      else if (content_type.find("multipart/form-data") !=
               std::string_view::npos) {
        return content_type::multipart;
      }
      else if (content_type.find("application/octet-stream") !=
               std::string_view::npos) {
        return content_type::octet_stream;
      }
      else {
        return content_type::string;
      }
    }

    if (is_websocket_) {
      return content_type::websocket;
    }

    return content_type::unknown;
  }